

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,vector<char,_std::allocator<char>_> *input,
          bool closedWorld)

{
  initializer_list<wasm::Type> __l;
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  int local_98;
  byte local_91;
  double dStack_90;
  int8_t bits;
  double ratio;
  double size;
  double MEAN_SIZE;
  Type local_70;
  Type local_68;
  _Vector_impl _Stack_60;
  iterator local_48;
  undefined8 local_40;
  uint32_t local_28;
  undefined1 local_21;
  vector<char,_std::allocator<char>_> *pvStack_20;
  bool closedWorld_local;
  vector<char,_std::allocator<char>_> *input_local;
  Module *wasm_local;
  TranslateToFuzzReader *this_local;
  
  this->wasm = wasm;
  this->closedWorld = closedWorld;
  local_21 = closedWorld;
  pvStack_20 = input;
  input_local = (vector<char,_std::allocator<char>_> *)wasm;
  wasm_local = (Module *)this;
  Builder::Builder(&this->builder,wasm);
  local_28 = *(uint32_t *)
              &input_local[0xf].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  Random::Random(&this->random,pvStack_20,(FeatureSet)local_28);
  this->allowMemory = true;
  this->allowOOB = true;
  this->preserveImportsAndExports = false;
  this->LOGGING_PERCENT = 0;
  Name::Name(&this->HANG_LIMIT_GLOBAL);
  Name::Name(&this->funcrefTableName);
  Name::Name(&this->exnrefTableName);
  std::
  unordered_map<wasm::Type,_wasm::Name,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>_>
  ::unordered_map(&this->logImportNames);
  Name::Name(&this->hashMemoryName);
  Name::Name(&this->throwImportName);
  Name::Name(&this->tableGetImportName);
  Name::Name(&this->tableSetImportName);
  Name::Name(&this->callExportImportName);
  Name::Name(&this->callExportCatchImportName);
  Name::Name(&this->callRefImportName);
  Name::Name(&this->callRefCatchImportName);
  Name::Name(&this->sleepImportName);
  std::
  unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map(&this->globalsByType);
  std::
  unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map(&this->mutableGlobalsByType);
  std::
  unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map(&this->immutableGlobalsByType);
  std::
  unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map(&this->importedImmutableGlobalsByType);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&this->loggableTypes);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->interestingHeapTypes);
  std::
  unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::unordered_map(&this->interestingHeapSubTypes);
  std::
  unordered_map<wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>_>
  ::unordered_map(&this->typeStructFields);
  std::
  unordered_map<wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::unordered_map(&this->typeArrays);
  std::
  vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ::vector(&this->mutableStructFields);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->mutableArrays);
  this->numAddedFunctions = 0;
  Name::Name(&this->trivialTag);
  this->funcContext = (FunctionCreationContext *)0x0;
  this->fuzzParams = (FuzzParamsContext *)0x0;
  std::
  unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>>
  ::unique_ptr<std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>,void>
            ((unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>>
              *)&this->globalParams);
  this->nesting = 0;
  this->trivialNesting = 0;
  _Stack_60._8_8_ = 4;
  _Stack_60._16_8_ = 5;
  local_68.id = 2;
  _Stack_60.super__Tp_alloc_type = (_Tp_alloc_type)0x3;
  _Stack_60._1_7_ = 0;
  local_48 = &local_68;
  local_40._0_1_ = true;
  local_40._1_3_ = 0;
  local_40._4_4_ = 0;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=(&this->loggableTypes,__l);
  bVar1 = FeatureSet::hasSIMD((FeatureSet *)
                              &input_local[0xf].super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.field_0x10);
  if (bVar1) {
    Type::Type(&local_70,v128);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(&this->loggableTypes,&local_70);
  }
  std::make_unique<wasm::TranslateToFuzzReader::FuzzParamsContext,wasm::TranslateToFuzzReader&>
            ((TranslateToFuzzReader *)&MEAN_SIZE);
  std::
  unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ::operator=(&this->globalParams,
              (unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
               *)&MEAN_SIZE);
  std::
  unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ::~unique_ptr((unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
                 *)&MEAN_SIZE);
  bVar1 = Random::oneIn(&this->random,2);
  if (bVar1) {
    size = 40960.0;
    sVar2 = Random::remaining(&this->random);
    auVar4._8_4_ = (int)(sVar2 >> 0x20);
    auVar4._0_8_ = sVar2;
    auVar4._12_4_ = 0x45300000;
    ratio = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    dStack_90 = ratio / 40960.0;
    local_91 = Random::get(&this->random);
    if ((local_91 & 1) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES * dStack_90);
    }
    if ((local_91 & 2) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_GLOBALS =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_GLOBALS * dStack_90);
    }
    if (((local_91 & 4) != 0) && ((this->fuzzParams->super_FuzzParams).HANG_LIMIT != 0)) {
      (this->fuzzParams->super_FuzzParams).HANG_LIMIT =
           (int)((double)(this->fuzzParams->super_FuzzParams).HANG_LIMIT * dStack_90);
      local_98 = 1;
      piVar3 = std::max<int>(&(this->fuzzParams->super_FuzzParams).HANG_LIMIT,&local_98);
      (this->fuzzParams->super_FuzzParams).HANG_LIMIT = *piVar3;
    }
    if (((local_91 & 8) != 0) && (1.0 < dStack_90)) {
      (this->fuzzParams->super_FuzzParams).TRIES =
           (int)((double)(this->fuzzParams->super_FuzzParams).TRIES * dStack_90);
    }
    if ((local_91 & 0x10) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE * dStack_90);
    }
  }
  bVar1 = oneIn(this,2);
  this->allowAddingUnreachableCode = bVar1;
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::vector<char>&& input,
                                             bool closedWorld)
  : wasm(wasm), closedWorld(closedWorld), builder(wasm),
    random(std::move(input), wasm.features) {

  // - funcref cannot be logged because referenced functions can be inlined or
  // removed during optimization
  // - there's no point in logging anyref because it is opaque
  // - don't bother logging tuples
  loggableTypes = {Type::i32, Type::i64, Type::f32, Type::f64};
  if (wasm.features.hasSIMD()) {
    loggableTypes.push_back(Type::v128);
  }

  // Setup params. Start with the defaults.
  globalParams = std::make_unique<FuzzParamsContext>(*this);

  // Some of the time, adjust parameters based on the size, e.g. allowing more
  // heap types in larger inputs, etc.
  if (random.oneIn(2)) {
    // A typical random wasm input from fuzz_opt.py is fairly large (to minimize
    // the process creation overhead of all the things we run from python), and
    // the defaults are tuned to that. This corresponds to INPUT_SIZE_MEAN in
    // scripts/fuzz_opt.py
    const double MEAN_SIZE = 40 * 1024;

    // As we have not read anything from the input, the remaining size is its
    // size.
    double size = random.remaining();
    auto ratio = size / MEAN_SIZE;

    auto bits = random.get();
    if (bits & 1) {
      fuzzParams->MAX_NEW_GC_TYPES *= ratio;
    }
    if (bits & 2) {
      fuzzParams->MAX_GLOBALS *= ratio;
    }
    if (bits & 4) {
      // Only adjust the limit if there is one.
      if (fuzzParams->HANG_LIMIT) {
        fuzzParams->HANG_LIMIT *= ratio;
        // There is a limit, so keep it non-zero to actually prevent hangs.
        fuzzParams->HANG_LIMIT = std::max(fuzzParams->HANG_LIMIT, 1);
      }
    }
    if (bits & 8) {
      // Only increase the number of tries. Trying fewer times does not help
      // find more interesting patterns.
      if (ratio > 1) {
        fuzzParams->TRIES *= ratio;
      }
    }
    if (bits & 16) {
      fuzzParams->MAX_ARRAY_SIZE *= ratio;
    }
  }

  // Half the time add no unreachable code so that we'll execute the most code
  // as possible with no early exits.
  allowAddingUnreachableCode = oneIn(2);
}